

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_Error tt_cmap14_init(TT_CMap14 cmap,FT_Byte *table)

{
  uint uVar1;
  
  (cmap->cmap).data = table;
  uVar1 = *(uint *)(table + 6);
  cmap->num_selectors =
       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  cmap->max_results = 0;
  cmap->results = (FT_UInt32 *)0x0;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_init( TT_CMap14  cmap,
                  FT_Byte*   table )
  {
    cmap->cmap.data = table;

    table               += 6;
    cmap->num_selectors  = FT_PEEK_ULONG( table );
    cmap->max_results    = 0;
    cmap->results        = NULL;

    return FT_Err_Ok;
  }